

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectMalformedBase64_Test::TestBody
          (BasicAuthIntegrationTest_shouldRejectMalformedBase64_Test *this)

{
  undefined8 *puVar1;
  _func_void__Any_data_ptr_void_ptr_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  pointer *__ptr;
  char *message;
  _Any_data __tmp;
  unique_ptr<curl_slist,_void_(*)(curl_slist_*)> header;
  Response metrics;
  Message local_88;
  AssertHelper local_80;
  code **local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  code *local_68;
  long local_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type ap_Stack_40 [2];
  _Any_data *local_30;
  _Any_data local_20;
  
  local_60 = curl_slist_append(0,"Authorization: Basic $");
  local_78 = &local_68;
  local_68 = curl_slist_free_all;
  uStack_70 = 0;
  uStack_6c = 0;
  local_58._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)
        &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
         super__Function_base._M_functor;
  local_58._8_8_ =
       *(undefined8 *)
        ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
                super__Function_base._M_functor + 8);
  *(code ***)
   &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
    super__Function_base._M_functor = local_78;
  *(undefined4 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 0xc) = 0;
  local_48 = (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
             super__Function_base._M_manager;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.super__Function_base
  ._M_manager = std::
                _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:282:22)>
                ::_M_manager;
  ap_Stack_40[0] =
       (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker =
       std::
       _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:282:22)>
       ::_M_invoke;
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  IntegrationTest::FetchMetrics
            ((Response *)&local_58,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x191;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_78,"metrics.code","401",(long *)local_58._M_pod_data,
             (int *)&local_88);
  if (local_78._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_88);
    if ((undefined8 *)CONCAT44(uStack_6c,uStack_70) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT44(uStack_6c,uStack_70);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x11f,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((long *)CONCAT44(local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_6c,uStack_70);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  if (local_30 != &local_20) {
    operator_delete(local_30);
  }
  if ((_Invoker_type *)local_58._8_8_ != ap_Stack_40) {
    operator_delete((void *)local_58._8_8_);
  }
  if (local_60 != 0) {
    (*local_68)();
  }
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectMalformedBase64) {
  std::unique_ptr<curl_slist, decltype(&curl_slist_free_all)> header(
      curl_slist_append(nullptr, "Authorization: Basic $"),
      curl_slist_free_all);

  fetchPrePerform_ = [&header](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, header.get());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}